

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O3

void __thiscall CVmObjTads::notify_delete(CVmObjTads *this,int in_root_set)

{
  char *pcVar1;
  
  pcVar1 = (this->super_CVmObject).ext_;
  if (pcVar1 != (char *)0x0) {
    if (*(void **)pcVar1 != (void *)0x0) {
      free(*(void **)pcVar1);
      pcVar1 = (this->super_CVmObject).ext_;
    }
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])(G_mem_X->varheap_,pcVar1);
    return;
  }
  return;
}

Assistant:

void CVmObjTads::notify_delete(VMG_ int in_root_set)
{
    /* free our extension */
    if (ext_ != 0)
    {
        /* tell the header to delete its memory */
        get_hdr()->free_mem();

        /* delete the extension */
        G_mem->get_var_heap()->free_mem(ext_);
    }
}